

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::FieldOptions::ByteSize(FieldOptions *this)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar5 = this->_has_bits_[0];
  if ((char)uVar5 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if ((uVar5 & 1) != 0) {
      uVar6 = this->ctype_;
      if ((int)uVar6 < 0) {
        iVar3 = 0xb;
      }
      else {
        iVar3 = 2;
        if (0x7f < uVar6) {
          iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
          iVar3 = iVar3 + 1;
          uVar5 = this->_has_bits_[0];
        }
      }
    }
    iVar3 = (uVar5 >> 2 & 2) + (uVar5 >> 1 & 2) + (uVar5 & 2) + iVar3;
    if ((uVar5 & 0x10) != 0) {
      psVar1 = this->experimental_map_key_;
      uVar6 = (uint)psVar1->_M_string_length;
      iVar4 = 1;
      if (0x7f < uVar6) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
        uVar6 = (uint)psVar1->_M_string_length;
        uVar5 = this->_has_bits_[0];
      }
      iVar3 = iVar3 + uVar6 + iVar4 + 1;
    }
    iVar3 = (uVar5 >> 4 & 2) + iVar3;
  }
  iVar4 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar3 = iVar3 + iVar4 * 2;
  if (0 < iVar4) {
    lVar7 = 0;
    do {
      uVar5 = UninterpretedOption::ByteSize
                        ((UninterpretedOption *)
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar7]);
      iVar4 = 1;
      if (0x7f < uVar5) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar5);
      }
      iVar3 = iVar3 + uVar5 + iVar4;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar4 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar4 = iVar4 + iVar3;
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar3 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar4 + iVar3;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int FieldOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
    if (has_ctype()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->ctype());
    }

    // optional bool packed = 2;
    if (has_packed()) {
      total_size += 1 + 1;
    }

    // optional bool lazy = 5 [default = false];
    if (has_lazy()) {
      total_size += 1 + 1;
    }

    // optional bool deprecated = 3 [default = false];
    if (has_deprecated()) {
      total_size += 1 + 1;
    }

    // optional string experimental_map_key = 9;
    if (has_experimental_map_key()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->experimental_map_key());
    }

    // optional bool weak = 10 [default = false];
    if (has_weak()) {
      total_size += 1 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}